

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O3

void __thiscall QTemporaryDir::~QTemporaryDir(QTemporaryDir *this)

{
  Data *pDVar1;
  QTemporaryDirPrivate *pQVar2;
  char *in_RSI;
  
  pQVar2 = this->d_ptr;
  if (pQVar2 == (QTemporaryDirPrivate *)0x0) {
    return;
  }
  if (pQVar2->autoRemove == true) {
    remove(this,in_RSI);
    pQVar2 = this->d_ptr;
    if (pQVar2 == (QTemporaryDirPrivate *)0x0) {
      pQVar2 = (QTemporaryDirPrivate *)0x0;
      goto LAB_002584bf;
    }
  }
  pDVar1 = (pQVar2->pathOrError).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> +
         -1);
    UNLOCK();
    if ((__int_type_conflict)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0)
    {
      QArrayData::deallocate(&((pQVar2->pathOrError).d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_002584bf:
  operator_delete(pQVar2,0x20);
  return;
}

Assistant:

QTemporaryDir::~QTemporaryDir()
{
    if (d_ptr) {
        if (d_ptr->autoRemove)
            remove();

        delete d_ptr;
    }
}